

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_monster_flags(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  parser_error pVar6;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"flags");
    pVar6 = PARSE_ERROR_NONE;
    if (_Var1) {
      pcVar4 = parser_getstr(p,"flags");
      pcVar4 = string_make(pcVar4);
      pcVar5 = strtok(pcVar4," |");
      pVar6 = PARSE_ERROR_NONE;
      while (pcVar5 != (char *)0x0) {
        eVar2 = grab_flag((bitflag *)((long)pvVar3 + 0x5c),0xc,r_info_flags,pcVar5);
        if (eVar2 != 0) {
          pcVar5 = format("bad monster race flag: %s",pcVar5);
          plog(pcVar5);
          pVar6 = PARSE_ERROR_INVALID_FLAG;
          break;
        }
        pcVar5 = strtok((char *)0x0," |");
      }
      string_free(pcVar4);
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_monster_flags(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	char *flags;
	char *s;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	if (!parser_hasval(p, "flags"))
		return PARSE_ERROR_NONE;
	flags = string_make(parser_getstr(p, "flags"));
	s = strtok(flags, " |");
	while (s) {
		if (grab_flag(r->flags, RF_SIZE, r_info_flags, s)) {
			plog(format("bad monster race flag: %s", s));
			string_free(flags);
			return PARSE_ERROR_INVALID_FLAG;
		}
		s = strtok(NULL, " |");
	}

	string_free(flags);
	return PARSE_ERROR_NONE;
}